

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O0

void ncnn::transpose_pack_B_tile_int8_avx2(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_00000068;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  Mat *in_stack_00000078;
  Mat *in_stack_00000080;
  
  transpose_pack_B_tile_int8
            (in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
             in_stack_0000006c,in_stack_00000068);
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}